

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bernstein_polynomial.cpp
# Opt level: O0

double r8mat_is_identity(int n,double *a)

{
  double dVar1;
  double local_30;
  double t;
  int j;
  int i;
  double error_frobenius;
  double *a_local;
  int n_local;
  
  _j = 0.0;
  for (t._4_4_ = 0; t._4_4_ < n; t._4_4_ = t._4_4_ + 1) {
    for (t._0_4_ = 0; t._0_4_ < n; t._0_4_ = t._0_4_ + 1) {
      if (t._4_4_ == t._0_4_) {
        local_30 = a[t._4_4_ + t._0_4_ * n] - 1.0;
      }
      else {
        local_30 = a[t._4_4_ + t._0_4_ * n];
      }
      _j = local_30 * local_30 + _j;
    }
  }
  dVar1 = sqrt(_j);
  return dVar1;
}

Assistant:

double r8mat_is_identity ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_IS_IDENTITY determines if an R8MAT is the identity.
//
//  Discussion:
//
//    An R8MAT is a matrix of real ( kind = 8 ) values.
//
//    The routine returns the Frobenius norm of A - I.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 July 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input, double A[N*N], the matrix.
//
//    Output, double R8MAT_IS_IDENTITY, the Frobenius norm
//    of the difference matrix A - I, which would be exactly zero
//    if A were the identity matrix.
//
{
  double error_frobenius;
  int i;
  int j;
  double t;

  error_frobenius = 0.0;

  for ( i = 0; i < n; i++ )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( i == j )
      {
        t = a[i+j*n] - 1.0;
      }
      else
      {
        t = a[i+j*n];
      }
      error_frobenius = error_frobenius + t * t;
    }
  }
  error_frobenius = sqrt ( error_frobenius );

  return error_frobenius;
}